

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O1

void anon_unknown.dwarf_2003477::WriteFilesArgument
               (ostream *os,string_view *keyword,
               vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
               *items,string *config,cmScriptGeneratorIndent indent)

{
  pointer pcVar1;
  Item *pIVar2;
  size_type sVar3;
  ostream *poVar4;
  pointer puVar5;
  bool bVar6;
  cmScriptGeneratorIndent cVar7;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> result;
  size_type *local_158;
  size_type local_148;
  undefined8 uStack_140;
  char local_138;
  long *local_130 [2];
  long local_120 [2];
  long *local_110;
  undefined8 local_108;
  long local_100 [2];
  string_view *local_f0;
  pointer local_e8;
  string local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  undefined8 local_b0;
  long *local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  size_t local_90;
  char *pcStack_88;
  char local_80 [32];
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  local_130[0] = local_120;
  pcVar1 = (config->_M_dataplus)._M_p;
  local_f0 = keyword;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_130,pcVar1,pcVar1 + config->_M_string_length);
  puVar5 = (items->
           super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_e8 = (items->
             super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != local_e8) {
    bVar6 = true;
    do {
      local_90 = 1;
      pcStack_88 = local_80;
      local_80[0] = '\"';
      pIVar2 = (puVar5->_M_t).
               super___uniq_ptr_impl<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet::Item_*,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>
               .super__Head_base<0UL,_cmInstallRuntimeDependencySet::Item_*,_false>._M_head_impl;
      (*pIVar2->_vptr_Item[2])(&local_110,pIVar2,local_130);
      local_c0._M_len = local_90;
      local_c0._M_str = pcStack_88;
      local_b0 = local_108;
      local_a8 = local_110;
      local_60 = 1;
      local_98 = local_50;
      local_50[0] = 0x22;
      local_a0 = 1;
      views._M_len = 3;
      views._M_array = &local_c0;
      local_58 = local_98;
      cmCatViews_abi_cxx11_(&local_e0,views);
      if (local_110 != local_100) {
        operator_delete(local_110,local_100[0] + 1);
      }
      sVar3 = local_e0._M_string_length;
      local_158 = &local_148;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
        uStack_140 = local_e0.field_2._8_8_;
      }
      else {
        local_158 = (size_type *)local_e0._M_dataplus._M_p;
      }
      local_148 = local_e0.field_2._M_allocated_capacity;
      local_138 = '\x01';
      if (bVar6) {
        cVar7.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            cVar7.Level = cVar7.Level + -1;
          } while (cVar7.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_f0->_M_str,local_f0->_M_len);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        bVar6 = false;
      }
      cVar7.Level = indent.Level;
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          cVar7.Level = cVar7.Level + -1;
        } while (cVar7.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"    ",4);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_158,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if ((local_138 == '\x01') && (local_138 = '\0', local_158 != &local_148)) {
        operator_delete(local_158,local_148 + 1);
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_e8);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  return;
}

Assistant:

void WriteFilesArgument(
  std::ostream& os, const cm::string_view& keyword,
  const std::vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item>>&
    items,
  const std::string& config, cmScriptGeneratorIndent indent)
{
  WriteMultiArgument(
    os, keyword, items, indent,
    [config](const std::unique_ptr<cmInstallRuntimeDependencySet::Item>& i)
      -> std::string { return cmStrCat('"', i->GetItemPath(config), '"'); });
}